

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinKrylovDemo_ls.c
# Opt level: O0

void SetInitialProfiles(N_Vector cc,N_Vector sc)

{
  long lVar1;
  long lVar2;
  long *in_RSI;
  long *in_RDI;
  int jx;
  int i;
  sunrealtype asStack_98 [3];
  sunrealtype stemp [6];
  sunrealtype ctemp [6];
  int local_1c;
  sunrealtype *sloc;
  sunrealtype *cloc;
  int jy;
  
  for (sloc._4_4_ = 0; sloc._4_4_ < 3; sloc._4_4_ = sloc._4_4_ + 1) {
    stemp[(long)sloc._4_4_ + 3] = 1.0;
    asStack_98[sloc._4_4_] = 1.0;
  }
  for (sloc._4_4_ = 3; sloc._4_4_ < 6; sloc._4_4_ = sloc._4_4_ + 1) {
    stemp[(long)sloc._4_4_ + 3] = 30000.0;
    asStack_98[sloc._4_4_] = 1e-05;
  }
  for (local_1c = 0; local_1c < 5; local_1c = local_1c + 1) {
    for (sloc._0_4_ = 0; (int)sloc < 5; sloc._0_4_ = (int)sloc + 1) {
      lVar1 = *(long *)(*in_RDI + 0x10);
      lVar2 = *(long *)(*in_RSI + 0x10);
      for (sloc._4_4_ = 0; sloc._4_4_ < 6; sloc._4_4_ = sloc._4_4_ + 1) {
        *(sunrealtype *)(lVar1 + (long)((int)sloc * 6 + local_1c * 0x1e) * 8 + (long)sloc._4_4_ * 8)
             = stemp[(long)sloc._4_4_ + 3];
        *(sunrealtype *)(lVar2 + (long)((int)sloc * 6 + local_1c * 0x1e) * 8 + (long)sloc._4_4_ * 8)
             = asStack_98[sloc._4_4_];
      }
    }
  }
  return;
}

Assistant:

static void SetInitialProfiles(N_Vector cc, N_Vector sc)
{
  int i, jx, jy;
  sunrealtype *cloc, *sloc;
  sunrealtype ctemp[NUM_SPECIES], stemp[NUM_SPECIES];

  /* Initialize arrays ctemp and stemp used in the loading process */
  for (i = 0; i < NUM_SPECIES / 2; i++)
  {
    ctemp[i] = PREYIN;
    stemp[i] = ONE;
  }
  for (i = NUM_SPECIES / 2; i < NUM_SPECIES; i++)
  {
    ctemp[i] = PREDIN;
    stemp[i] = SUN_RCONST(0.00001);
  }

  /* Load initial profiles into cc and sc vector from ctemp and stemp. */
  for (jy = 0; jy < MY; jy++)
  {
    for (jx = 0; jx < MX; jx++)
    {
      cloc = IJ_Vptr(cc, jx, jy);
      sloc = IJ_Vptr(sc, jx, jy);
      for (i = 0; i < NUM_SPECIES; i++)
      {
        cloc[i] = ctemp[i];
        sloc[i] = stemp[i];
      }
    }
  }
}